

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::Test::HasNonfatalFailure(void)

{
  bool bVar1;
  UnitTestImpl *this;
  
  this = internal::GetUnitTestImpl();
  internal::UnitTestImpl::current_test_result(this);
  bVar1 = TestResult::HasNonfatalFailure((TestResult *)0x19fa96);
  return bVar1;
}

Assistant:

bool Test::HasNonfatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->
      HasNonfatalFailure();
}